

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall gvr::Model::setOriginFromPLY(Model *this,PLYReader *ply)

{
  int iVar1;
  istream *piVar2;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  long lVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  string s;
  istringstream in;
  byte abStack_190 [352];
  
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::getComments(ply,&comment);
  lVar3 = 0;
  uVar4 = 0;
  do {
    if ((ulong)((long)comment.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)comment.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&comment);
      return;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&in,
               (string *)
               ((long)&((comment.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
               _S_in);
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&in,(string *)&s);
    iVar1 = std::__cxx11::string::compare((char *)&s);
    if (iVar1 == 0) {
LAB_00115344:
      piVar2 = std::istream::_M_extract<double>((double *)&in);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      std::istream::_M_extract<double>((double *)piVar2);
      if ((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) {
        (this->origin).v[0] = 0.0;
        (this->origin).v[1] = 0.0;
        (this->origin).v[2] = 0.0;
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&s);
      if (iVar1 == 0) goto LAB_00115344;
    }
    iVar1 = std::__cxx11::string::compare((char *)&s);
    if (iVar1 == 0) {
LAB_001153ab:
      in_00 = gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)&in,&this->Rc);
      gmath::operator>>(in_00,&this->Tc);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&s);
      if (iVar1 == 0) goto LAB_001153ab;
    }
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while( true );
}

Assistant:

void Model::setOriginFromPLY(PLYReader &ply)
{
  std::vector<std::string> comment;

  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    std::istringstream in(comment[i]);
    std::string s;

    in >> s;

    if (s.compare("Origin") == 0 || s.compare("origin") == 0)
    {
      in >> origin[0] >> origin[1] >> origin[2];

      if (in.fail())
      {
        origin[0]=origin[1]=origin[2]=0;
      }
    }

    if (s.compare("Camera") == 0 || s.compare("camera") == 0)
    {
      try
      {
        in >> Rc >> Tc;
      }
      catch (const gutil::Exception &)
      {
        Rc=0;
        Tc=0;
      }
    }
  }
}